

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_negate(secp256k1_scalar *r,secp256k1_scalar *a)

{
  int iVar1;
  uint64_t uVar2;
  secp256k1_scalar *in_RSI;
  secp256k1_scalar *in_RDI;
  secp256k1_uint128 t;
  uint64_t nonzero;
  secp256k1_uint128 sStack_28;
  ulong local_18;
  secp256k1_scalar *local_10;
  secp256k1_scalar *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x105188);
  local_18 = -(long)(int)(uint)(iVar1 == 0);
  secp256k1_scalar_verify(local_10);
  secp256k1_u128_from_u64(&sStack_28,local_10->d[0] ^ 0xffffffffffffffff);
  secp256k1_u128_accum_u64(&sStack_28,0xbfd25e8cd0364142);
  uVar2 = secp256k1_u128_to_u64(&sStack_28);
  local_8->d[0] = uVar2 & local_18;
  secp256k1_u128_rshift(&sStack_28,0x40);
  secp256k1_u128_accum_u64(&sStack_28,local_10->d[1] ^ 0xffffffffffffffff);
  secp256k1_u128_accum_u64(&sStack_28,0xbaaedce6af48a03b);
  uVar2 = secp256k1_u128_to_u64(&sStack_28);
  local_8->d[1] = uVar2 & local_18;
  secp256k1_u128_rshift(&sStack_28,0x40);
  secp256k1_u128_accum_u64(&sStack_28,local_10->d[2] ^ 0xffffffffffffffff);
  secp256k1_u128_accum_u64(&sStack_28,0xfffffffffffffffe);
  uVar2 = secp256k1_u128_to_u64(&sStack_28);
  local_8->d[2] = uVar2 & local_18;
  secp256k1_u128_rshift(&sStack_28,0x40);
  secp256k1_u128_accum_u64(&sStack_28,local_10->d[3] ^ 0xffffffffffffffff);
  secp256k1_u128_accum_u64(&sStack_28,0xffffffffffffffff);
  uVar2 = secp256k1_u128_to_u64(&sStack_28);
  local_8->d[3] = uVar2 & local_18;
  secp256k1_scalar_verify(local_8);
  return;
}

Assistant:

static void secp256k1_scalar_negate(secp256k1_scalar *r, const secp256k1_scalar *a) {
    uint64_t nonzero = 0xFFFFFFFFFFFFFFFFULL * (secp256k1_scalar_is_zero(a) == 0);
    secp256k1_uint128 t;
    SECP256K1_SCALAR_VERIFY(a);

    secp256k1_u128_from_u64(&t, ~a->d[0]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_0 + 1);
    r->d[0] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, ~a->d[1]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_1);
    r->d[1] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, ~a->d[2]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_2);
    r->d[2] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, ~a->d[3]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_3);
    r->d[3] = secp256k1_u128_to_u64(&t) & nonzero;

    SECP256K1_SCALAR_VERIFY(r);
}